

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Int __thiscall Json::Value::asInt(Value *this)

{
  bool bVar1;
  ValueType VVar2;
  String local_688;
  ostringstream local_668 [8];
  OStringStream oss_3;
  String local_4f0;
  ostringstream local_4d0 [8];
  OStringStream oss_2;
  String local_358;
  ostringstream local_338 [8];
  OStringStream oss_1;
  String local_1c0;
  ostringstream local_190 [8];
  OStringStream oss;
  Value *this_local;
  
  VVar2 = type(this);
  switch(VVar2) {
  case nullValue:
    this_local._4_4_ = 0;
    break;
  case intValue:
    bVar1 = isInt(this);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::operator<<((ostream *)local_190,"LargestInt out of Int range");
      std::__cxx11::ostringstream::str();
      throwLogicError(&local_1c0);
    }
    this_local._4_4_ = (uint)(this->value_).int_;
    break;
  case uintValue:
    bVar1 = isInt(this);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_338);
      std::operator<<((ostream *)local_338,"LargestUInt out of Int range");
      std::__cxx11::ostringstream::str();
      throwLogicError(&local_358);
    }
    this_local._4_4_ = (uint)(this->value_).int_;
    break;
  case realValue:
    bVar1 = InRange<int,int>((this->value_).real_,-0x80000000,0x7fffffff);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4d0);
      std::operator<<((ostream *)local_4d0,"double out of Int range");
      std::__cxx11::ostringstream::str();
      throwLogicError(&local_4f0);
    }
    this_local._4_4_ = (uint)(this->value_).real_;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_668);
    std::operator<<((ostream *)local_668,"Value is not convertible to Int.");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_688);
  case booleanValue:
    this_local._4_4_ = (uint)(((this->value_).bool_ & 1U) != 0);
  }
  return this_local._4_4_;
}

Assistant:

Value::Int Value::asInt() const {
  switch (type()) {
  case intValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestInt out of Int range");
    return Int(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestUInt out of Int range");
    return Int(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt, maxInt),
                        "double out of Int range");
    return Int(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int.");
}